

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

double __thiscall
tetgenmesh::interiorangle(tetgenmesh *this,double *o,double *p1,double *p2,double *n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double np [3];
  double local_38;
  double local_30;
  double local_28;
  
  dVar4 = *p1 - *o;
  dVar5 = p1[1] - o[1];
  dVar3 = p1[2] - o[2];
  dVar6 = *p2 - *o;
  dVar8 = p2[1] - o[1];
  dVar7 = p2[2] - o[2];
  dVar1 = dVar3 * dVar3 + dVar4 * dVar4 + dVar5 * dVar5;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar2 = dVar7 * dVar7 + dVar6 * dVar6 + dVar8 * dVar8;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar3 = (dVar3 * dVar7 + dVar4 * dVar6 + dVar5 * dVar8) / (dVar1 * dVar2);
  dVar1 = 1.0;
  if ((dVar3 <= 1.0) && (dVar1 = dVar3, dVar3 < -1.0)) {
    dVar1 = -1.0;
  }
  dVar1 = acos(dVar1);
  if (n != (double *)0x0) {
    local_38 = *o + *n;
    local_30 = o[1] + n[1];
    local_28 = o[2] + n[2];
    dVar3 = orient3d(p1,o,&local_38,p2);
    if (0.0 < dVar3) {
      dVar1 = (PI + PI) - dVar1;
    }
  }
  return dVar1;
}

Assistant:

REAL tetgenmesh::interiorangle(REAL* o, REAL* p1, REAL* p2, REAL* n)
{
  REAL v1[3], v2[3], np[3];
  REAL theta, costheta, lenlen;
  REAL ori, len1, len2;

  // Get the interior angle (0 - PI) between o->p1, and o->p2.
  v1[0] = p1[0] - o[0];
  v1[1] = p1[1] - o[1];
  v1[2] = p1[2] - o[2];
  v2[0] = p2[0] - o[0];
  v2[1] = p2[1] - o[1];
  v2[2] = p2[2] - o[2];
  len1 = sqrt(dot(v1, v1));
  len2 = sqrt(dot(v2, v2));
  lenlen = len1 * len2;

  costheta = dot(v1, v2) / lenlen;
  if (costheta > 1.0) {
    costheta = 1.0; // Roundoff. 
  } else if (costheta < -1.0) {
    costheta = -1.0; // Roundoff. 
  }
  theta = acos(costheta);
  if (n != NULL) {
    // Get a point above the face (o, p1, p2);
    np[0] = o[0] + n[0];
    np[1] = o[1] + n[1];
    np[2] = o[2] + n[2];
    // Adjust theta (0 - 2 * PI).
    ori = orient3d(p1, o, np, p2);
    if (ori > 0.0) {
      theta = 2 * PI - theta;
    }
  }

  return theta;
}